

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

btVector3 __thiscall btConvexHullInternal::getCoordinates(btConvexHullInternal *this,Vertex *v)

{
  btScalar bVar1;
  btVector3 bVar2;
  btVector3 p;
  btVector3 local_30;
  btVector3 local_20;
  
  bVar1 = Vertex::xvalue(v);
  local_30.m_floats[this->medAxis] = bVar1;
  bVar1 = Vertex::yvalue(v);
  local_30.m_floats[this->maxAxis] = bVar1;
  bVar1 = Vertex::zvalue(v);
  local_30.m_floats[this->minAxis] = bVar1;
  local_20 = operator*(&local_30,&this->scaling);
  bVar2 = operator+(&local_20,&this->center);
  return (btVector3)bVar2.m_floats;
}

Assistant:

btVector3 btConvexHullInternal::getCoordinates(const Vertex* v)
{
	btVector3 p;
	p[medAxis] = v->xvalue();
	p[maxAxis] = v->yvalue();
	p[minAxis] = v->zvalue();
	return p * scaling + center;
}